

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridTriangles
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  AdjacencyGridPoint *pAVar1;
  AdjacencyGridPoint *pAVar2;
  AdjacencyGridPoint *pAVar3;
  AdjacencyGridPoint *pAVar4;
  uint uVar5;
  AdjacencyGrid *pAVar6;
  AdjacencyGridPoint *pAVar7;
  int iVar8;
  int iVar9;
  AdjacencyGridTriangle *pAVar10;
  AdjacencyGridPoint **ppAVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  
  uVar5 = this->m_grid_granulity;
  uVar14 = uVar5 * uVar5 * 2;
  pAVar10 = (AdjacencyGridTriangle *)operator_new__((ulong)uVar14 * 0x30);
  pAVar6 = test_data->m_grid;
  pAVar6->m_triangles = pAVar10;
  pAVar6->m_n_triangles = uVar14;
  uVar14 = uVar5 * uVar5 & 0x7fffffff;
  if (uVar14 != 0) {
    pAVar7 = pAVar6->m_points;
    ppAVar11 = &pAVar10[1].m_vertex_z_adjacent;
    uVar12 = 0;
    do {
      iVar9 = (int)((uVar12 & 0xffffffff) / (ulong)uVar5);
      iVar13 = iVar9 * (uVar5 + 1);
      iVar8 = (int)((uVar12 & 0xffffffff) % (ulong)uVar5);
      pAVar1 = pAVar7 + (uint)(iVar13 + iVar8);
      pAVar2 = pAVar7 + (iVar13 + iVar8 + 1);
      iVar9 = (iVar9 + 1) * (uVar5 + 1);
      pAVar3 = pAVar7 + (uint)(iVar8 + iVar9);
      pAVar4 = pAVar7 + (iVar9 + iVar8 + 1);
      ppAVar11[-0xb] = pAVar1;
      ppAVar11[-10] = pAVar2;
      ppAVar11[-9] = pAVar4;
      ppAVar11[-8] = pAVar3;
      ppAVar11[-7] = pAVar3;
      ppAVar11[-6] = pAVar4;
      ((AdjacencyGridTriangle *)(ppAVar11 + -5))->m_vertex_x = pAVar1;
      ppAVar11[-4] = pAVar2;
      ppAVar11[-3] = pAVar2;
      ppAVar11[-2] = pAVar1;
      ppAVar11[-1] = pAVar4;
      *ppAVar11 = pAVar3;
      uVar12 = uVar12 + 1;
      ppAVar11 = ppAVar11 + 0xc;
    } while (uVar14 != uVar12);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridTriangles(AdjacencyTestData& test_data)
{
	const int	nTrianglesPerQuad = 2;
	unsigned int nTriangles		   = m_grid_granulity * m_grid_granulity * nTrianglesPerQuad;

	test_data.m_grid->m_triangles   = new AdjacencyGridTriangle[nTriangles];
	test_data.m_grid->m_n_triangles = nTriangles;

	for (unsigned int nQuad = 0; nQuad < (nTriangles / nTrianglesPerQuad); ++nQuad)
	{
		unsigned int quadTLX = (nQuad) % m_grid_granulity;
		unsigned int quadTLY = (nQuad) / m_grid_granulity;

		/* Grid is built off points row-by-row. */
		AdjacencyGridPoint* pointTL = test_data.m_grid->m_points + (quadTLY * (m_grid_granulity + 1) + quadTLX);
		AdjacencyGridPoint* pointTR = test_data.m_grid->m_points + (quadTLY * (m_grid_granulity + 1) + quadTLX + 1);
		AdjacencyGridPoint* pointBL = test_data.m_grid->m_points + ((quadTLY + 1) * (m_grid_granulity + 1) + quadTLX);
		AdjacencyGridPoint* pointBR =
			test_data.m_grid->m_points + ((quadTLY + 1) * (m_grid_granulity + 1) + quadTLX + 1);

		/* Note: In many cases, the adjacency data used below is not correct topologically-wise.
		 *       However, since we're not doing any rendering, we're safe as long as unique data
		 *       is used.
		 */
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_x			 = pointTL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_x_adjacent = pointTR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_y			 = pointBR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_y_adjacent = pointBL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_z			 = pointBL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 0].m_vertex_z_adjacent = pointBR;

		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_x			 = pointTL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_x_adjacent = pointTR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_y			 = pointTR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_y_adjacent = pointTL;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_z			 = pointBR;
		test_data.m_grid->m_triangles[nQuad * nTrianglesPerQuad + 1].m_vertex_z_adjacent = pointBL;
	}
}